

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *type;
  Message *pMVar5;
  MessageLite *this_00;
  LogMessage *pLVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  AlphaNum *in_R8;
  FieldDescriptor *value_field;
  string full_type_name;
  FieldDescriptor *type_url_field;
  string serialized_value;
  DynamicMessageFactory factory;
  FieldDescriptor *local_180;
  undefined1 local_178 [16];
  char *local_168 [5];
  string local_140;
  string local_120;
  FieldDescriptor *local_100;
  string local_f8;
  string local_d8;
  DynamicMessageFactory local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  long *plVar4;
  undefined4 extraout_var_01;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&local_100,&local_180);
  if (!bVar2) {
    return false;
  }
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0xc0))(&local_120,plVar4,message,local_100);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  bVar2 = internal::ParseAnyTypeUrl(&local_120,&local_140);
  if (bVar2) {
    iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
    type = DescriptorPool::FindMessageTypeByName
                     (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x10) + 0x10)
                      ,&local_140);
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&local_b8);
      pMVar5 = DynamicMessageFactory::GetPrototype(&local_b8,type);
      iVar3 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
      this_00 = (MessageLite *)CONCAT44(extraout_var_01,iVar3);
      (**(code **)(*plVar4 + 0xc0))(&local_d8,plVar4,message,local_180);
      if (this_00 == (MessageLite *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
                     );
      }
      bVar2 = MessageLite::ParseFromString(this_00,&local_d8);
      if (bVar2) {
        local_178._0_8_ = "[";
        local_178._8_8_ = (char *)0x1;
        local_90.piece_data_ = local_120._M_dataplus._M_p;
        local_90.piece_size_ = local_120._M_string_length;
        local_60.piece_data_ = "]";
        local_60.piece_size_ = 1;
        StrCat_abi_cxx11_(&local_f8,(protobuf *)local_178,&local_90,&local_60,in_R8);
        TextGenerator::Print(generator,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        for (; p_Var8 != (_Base_ptr)0x0;
            p_Var8 = (&p_Var8->_M_left)[*(FieldDescriptor **)(p_Var8 + 1) < local_180]) {
          if (*(FieldDescriptor **)(p_Var8 + 1) >= local_180) {
            p_Var7 = p_Var8;
          }
        }
        p_Var8 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var8 = p_Var7, local_180 < *(FieldDescriptor **)(p_Var7 + 1))) {
          p_Var8 = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)p_Var8 == p_Var1) {
          p_Var8 = (_Base_ptr)(this->default_field_value_printer_).ptr_;
        }
        else {
          p_Var8 = p_Var8[1]._M_parent;
        }
        (**(code **)(*(long *)p_Var8 + 0x68))
                  (local_178,p_Var8,message,0xffffffff,0,this->single_line_mode_);
        TextGenerator::Print(generator,(char *)local_178._0_8_,local_178._8_8_);
        if ((char **)local_178._0_8_ != local_168) {
          operator_delete((void *)local_178._0_8_,(ulong)(local_168[0] + 1));
        }
        std::__cxx11::string::append((char *)&generator->indent_);
        Print(this,(Message *)this_00,generator);
        TextGenerator::Outdent(generator);
        (**(code **)(*(long *)p_Var8 + 0x70))
                  (local_178,p_Var8,message,0xffffffff,0,this->single_line_mode_);
        TextGenerator::Print(generator,(char *)local_178._0_8_,local_178._8_8_);
        if ((char **)local_178._0_8_ != local_168) {
          operator_delete((void *)local_178._0_8_,(ulong)(local_168[0] + 1));
        }
      }
      else {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_178,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x635);
        pLVar6 = internal::LogMessage::operator<<((LogMessage *)local_178,&local_120);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,": failed to parse contents");
        internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar6);
        internal::LogMessage::~LogMessage((LogMessage *)local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      (*this_00->_vptr_MessageLite[1])(this_00);
      DynamicMessageFactory::~DynamicMessageFactory(&local_b8);
      goto LAB_00333e86;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_178,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x62d);
    pLVar6 = internal::LogMessage::operator<<((LogMessage *)local_178,"Proto type ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_120);
    pLVar6 = internal::LogMessage::operator<<(pLVar6," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_178);
  }
  bVar2 = false;
LAB_00333e86:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator& generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const string& type_url = reflection->GetString(message, type_url_field);
  string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const google::protobuf::Descriptor* value_descriptor =
      message.GetDescriptor()->file()->pool()->FindMessageTypeByName(
          full_type_name);
  if (value_descriptor == NULL) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  google::protobuf::scoped_ptr<google::protobuf::Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator.Print(StrCat("[", type_url, "]"));
  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, value_field, default_field_value_printer_.get());
  generator.Print(
      printer->PrintMessageStart(message, -1, 0, single_line_mode_));
  generator.Indent();
  Print(*value_message, generator);
  generator.Outdent();
  generator.Print(printer->PrintMessageEnd(message, -1, 0, single_line_mode_));
  return true;
}